

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O2

LightRayRecord __thiscall cert::PointLight::visible(PointLight *this,Vec3 *point,Vec3 *normal)

{
  LightRayRecord LVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vec3 VVar6;
  undefined4 local_48;
  Vec3 local_28;
  
  VVar6 = operator-(&(this->super_Light).position,point);
  local_28.z = VVar6.z;
  local_28._0_8_ = VVar6._0_8_;
  fVar2 = Vec3::length(&local_28);
  VVar6 = normalize(&local_28);
  fVar3 = VVar6.y * normal->y + normal->x * VVar6.x + VVar6.z * normal->z;
  local_48 = CONCAT31(local_48._1_3_,0.0 < fVar3);
  VVar6 = operator*(&(this->super_Light).color,fVar3);
  fVar3 = this->strength;
  fVar2 = fVar2 * fVar2;
  auVar4._0_4_ = fVar3 * VVar6.x;
  auVar4._4_4_ = fVar3 * VVar6.y;
  auVar4._8_4_ = extraout_XMM0_Dc * 0.0;
  auVar4._12_4_ = extraout_XMM0_Dd * 0.0;
  auVar5._4_4_ = fVar2;
  auVar5._0_4_ = fVar2;
  auVar5._8_4_ = extraout_XMM0_Db;
  auVar5._12_4_ = extraout_XMM0_Db;
  auVar5 = divps(auVar4,auVar5);
  LVar1.attenuation.x = (float)(int)auVar5._0_8_;
  LVar1.attenuation.y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  LVar1._0_4_ = local_48;
  LVar1.attenuation.z = (VVar6.z * fVar3) / fVar2;
  return LVar1;
}

Assistant:

constexpr LightRayRecord visible (Vec3 const& point, Vec3 const& normal) override
	{
		Vec3 direction = position - point;
		float distance = direction.length ();
		float lambert = dot (normal, normalize (direction));

		return { .visible = lambert > 0.0f, .attenuation = color * lambert * strength / (distance * distance) };
	}